

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::PlatformIs64Bit(cmMakefile *this)

{
  int iVar1;
  cmValue cVar2;
  bool bVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CMAKE_SIZEOF_VOID_P","");
  cVar2 = GetDefinition(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (cVar2.Value == (string *)0x0) {
    bVar3 = false;
  }
  else {
    iVar1 = atoi(((cVar2.Value)->_M_dataplus)._M_p);
    bVar3 = iVar1 == 8;
  }
  return bVar3;
}

Assistant:

bool cmMakefile::PlatformIs64Bit() const
{
  if (cmValue sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr->c_str()) == 8;
  }
  return false;
}